

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

_Bool IsFileExtension(char *fileName,char *ext)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  bool bVar4;
  int i;
  long lVar5;
  int extCount;
  char local_38 [16];
  undefined1 local_28;
  
  pcVar2 = GetFileExtension(fileName);
  if (pcVar2 == (char *)0x0) {
    bVar4 = false;
  }
  else {
    extCount = 0;
    ppcVar3 = TextSplit(ext,';',&extCount);
    local_28 = 0;
    pcVar2 = TextToLower(pcVar2);
    strncpy(local_38,pcVar2,0x10);
    lVar5 = 0;
    do {
      bVar4 = lVar5 < extCount;
      if (extCount <= lVar5) {
        return bVar4;
      }
      pcVar2 = TextToLower(ppcVar3[lVar5]);
      iVar1 = strcmp(local_38,pcVar2);
      lVar5 = lVar5 + 1;
    } while (iVar1 != 0);
  }
  return bVar4;
}

Assistant:

bool IsFileExtension(const char *fileName, const char *ext)
{
    #define MAX_FILE_EXTENSION_LENGTH  16

    bool result = false;
    const char *fileExt = GetFileExtension(fileName);

    if (fileExt != NULL)
    {
#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_TEXT_MANIPULATION)
        int extCount = 0;
        const char **checkExts = TextSplit(ext, ';', &extCount); // WARNING: Module required: rtext

        char fileExtLower[MAX_FILE_EXTENSION_LENGTH + 1] = { 0 };
        strncpy(fileExtLower, TextToLower(fileExt), MAX_FILE_EXTENSION_LENGTH); // WARNING: Module required: rtext

        for (int i = 0; i < extCount; i++)
        {
            if (strcmp(fileExtLower, TextToLower(checkExts[i])) == 0)
            {
                result = true;
                break;
            }
        }
#else
        if (strcmp(fileExt, ext) == 0) result = true;
#endif
    }

    return result;
}